

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall
QSidebar::setModelAndUrls(QSidebar *this,QFileSystemModel *model,QList<QUrl> *newUrls)

{
  QModelIndex *index;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar1;
  offset_in_QItemSelectionModel_to_subr in_RDX;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  QUrlModel *in_stack_ffffffffffffff10;
  QAbstractItemDelegate *in_stack_ffffffffffffff28;
  Connection *this_01;
  undefined4 in_stack_ffffffffffffff30;
  ContextMenuPolicy policy;
  QUrlModel *this_02;
  ContextType *in_stack_ffffffffffffff58;
  Object *in_stack_ffffffffffffff60;
  QFileSystemModel *in_stack_ffffffffffffff70;
  QUrlModel *in_stack_ffffffffffffff78;
  undefined1 local_68 [8];
  ConnectionType in_stack_ffffffffffffffa0;
  undefined1 local_50 [24];
  code *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  undefined8 local_18;
  Connection local_10;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  QListView::setUniformItemSizes
            ((QListView *)in_stack_ffffffffffffff10,SUB41((uint)in_stack_ffffffffffffff0c >> 0x18,0)
            );
  index = (QModelIndex *)operator_new(0x68);
  QUrlModel::QUrlModel
            (in_stack_ffffffffffffff10,
             (QObject *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  *(QModelIndex **)(in_RDI + 1) = index;
  QUrlModel::setFileSystemModel(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  (**(code **)(*(offset_in_QSidebar_to_subr *)in_RDI + 0x1c8))
            (in_RDI,*(offset_in_QSidebar_to_subr *)(in_RDI + 1));
  this_00 = (QAbstractItemView *)operator_new(0x10);
  QSideBarDelegate::QSideBarDelegate
            ((QSideBarDelegate *)in_stack_ffffffffffffff10,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QAbstractItemView::setItemDelegate(this_00,in_stack_ffffffffffffff28);
  QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff10);
  local_28._8_8_ = clicked;
  local_18._0_1_ = false;
  local_18._1_7_ = 0;
  this_01 = &local_10;
  QObject::
  connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QSidebar::*)(QModelIndex_const&)>
            (in_stack_ffffffffffffff60,in_RDX,in_stack_ffffffffffffff58,
             (offset_in_QSidebar_to_subr *)in_RDI,in_stack_ffffffffffffffa0);
  QMetaObject::Connection::~Connection(this_01);
  policy = CustomContextMenu;
  QAbstractItemView::setDragDropMode
            ((QAbstractItemView *)CONCAT44(3,in_stack_ffffffffffffff30),
             (DragDropMode)((ulong)this_01 >> 0x20));
  QWidget::setContextMenuPolicy(in_RDI,policy);
  local_38 = showContextMenu;
  local_30 = 0;
  this_02 = (QUrlModel *)local_28;
  QObject::connect<void(QWidget::*)(QPoint_const&),void(QSidebar::*)(QPoint_const&)>
            ((Object *)QWidget::customContextMenuRequested,in_RDX,in_stack_ffffffffffffff58,
             (offset_in_QSidebar_to_subr *)in_RDI,in_stack_ffffffffffffffa0);
  QMetaObject::Connection::~Connection((Connection *)this_02);
  QUrlModel::setUrls(this_02,(QList<QUrl> *)CONCAT44(policy,in_stack_ffffffffffffff30));
  pQVar1 = QAbstractItemView::model(this_00);
  QModelIndex::QModelIndex((QModelIndex *)0x786990);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_50,pQVar1,0,0,local_68);
  QAbstractItemView::setCurrentIndex(this_00,index);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSidebar::setModelAndUrls(QFileSystemModel *model, const QList<QUrl> &newUrls)
{
    setUniformItemSizes(true);
    urlModel = new QUrlModel(this);
    urlModel->setFileSystemModel(model);
    setModel(urlModel);
    setItemDelegate(new QSideBarDelegate(this));

    connect(selectionModel(), &QItemSelectionModel::currentChanged,
            this, &QSidebar::clicked);
#if QT_CONFIG(draganddrop)
    setDragDropMode(QAbstractItemView::DragDrop);
#endif
#if QT_CONFIG(menu)
    setContextMenuPolicy(Qt::CustomContextMenu);
    connect(this, &QSidebar::customContextMenuRequested,
            this, &QSidebar::showContextMenu);
#endif
    urlModel->setUrls(newUrls);
    setCurrentIndex(this->model()->index(0,0));
}